

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::createBuffers(GLShaderProgram *this)

{
  pointer pGVar1;
  uint32_t uVar2;
  invalid_argument *this_00;
  iterator __begin2;
  pointer pGVar3;
  GLint nAvailTextureUnits;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*glad_glBindVertexArray)(this->vaoHandle);
  (*glad_glGetIntegerv)(0x8872,&nAvailTextureUnits);
  pGVar1 = (this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar3 = (this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)(((long)pGVar1 - (long)pGVar3) / 0x50) <= nAvailTextureUnits) {
    uVar2 = 0;
    for (; pGVar3 != pGVar1; pGVar3 = pGVar3 + 1) {
      pGVar3->index = uVar2;
      uVar2 = uVar2 + 1;
    }
    checkGLError(true);
    return;
  }
  this_00 = (invalid_argument *)
            __cxa_allocate_exception(0x10,pGVar1,((long)pGVar1 - (long)pGVar3) % 0x50);
  std::__cxx11::to_string(&local_78,nAvailTextureUnits);
  std::operator+(&local_58,
                 "Attempted to load more textures than the number of available texture units (",
                 &local_78);
  std::operator+(&local_38,&local_58,").");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::createBuffers() {
  bindVAO();

  // === Generate textures

  // Verify we have enough texture units
  GLint nAvailTextureUnits;
  glGetIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &nAvailTextureUnits);
  if ((int)textures.size() > nAvailTextureUnits) {
    throw std::invalid_argument("Attempted to load more textures than the number of available texture "
                                "units (" +
                                std::to_string(nAvailTextureUnits) + ").");
  }

  // Set indices sequentially
  uint32_t iTexture = 0;
  for (GLShaderTexture& t : textures) {
    t.index = iTexture++;
  }

  checkGLError();
}